

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

int queue_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  int iVar2;
  code *pcVar3;
  uint32_t *count;
  mixed_buffer ***buffers;
  
  pvVar1 = segment->data;
  if (field == 0x25) {
    buffers = (mixed_buffer ***)((long)pvVar1 + 0x10);
    count = (uint32_t *)((long)pvVar1 + 0x18);
  }
  else {
    if (field != 0x24) {
      if (field == 1) {
        if (*value == '\x01') {
          pcVar3 = queue_segment_mix_bypass;
        }
        else {
          pcVar3 = queue_segment_mix;
        }
        segment->mix = pcVar3;
        return 1;
      }
      mixed_err(7);
      return 0;
    }
    buffers = (mixed_buffer ***)((long)pvVar1 + 0x20);
    count = (uint32_t *)((long)pvVar1 + 0x28);
  }
  iVar2 = queue_resize_buffers(buffers,count,*value);
  return iVar2;
}

Assistant:

int queue_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  switch(field){
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = queue_segment_mix_bypass;
    }else{
      segment->mix = queue_segment_mix;
    }
    break;
  case MIXED_IN_COUNT: return queue_resize_buffers(&data->in, &data->in_count, *(uint32_t *)value);
  case MIXED_OUT_COUNT: return queue_resize_buffers(&data->out, &data->out_count, *(uint32_t *)value);
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}